

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O1

void __thiscall xray_re::se_respawn::state_write(se_respawn *this,xr_packet *packet)

{
  ushort uVar1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_30;
  
  cse_alife_smart_zone::state_write(&this->super_cse_alife_smart_zone,packet);
  uVar1 = (this->super_cse_alife_smart_zone).super_cse_alife_space_restrictor.
          super_cse_alife_dynamic_object.super_cse_alife_object.super_cse_abstract.m_version;
  if (uVar1 < 0x76) {
    if (uVar1 != 0x65) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x1b4,"virtual void xray_re::se_respawn::state_write(xr_packet &)");
    }
  }
  else {
    (*packet->_vptr_xr_packet[0x15])
              (packet,(long)(this->m_spawned_obj).
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_spawned_obj).
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 1);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&local_30,&this->m_spawned_obj);
    (*packet->_vptr_xr_packet[2])(packet,&local_30);
    if (local_30.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_30.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_30.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_30.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void se_respawn::state_write(xr_packet& packet)
{
	cse_alife_smart_zone::state_write(packet);
	if (m_version >= CSE_VERSION_SOC) {
		packet.w_size_u8(m_spawned_obj.size());
		packet.w_seq(m_spawned_obj);
	} else if (m_version == CSE_VERSION_2215) {
		// se_respawn will be represented as smart_terrain, but we are
		// safe because xrAI won't read data beyond cse_alife_smart_zone.
	} else {
		xr_not_implemented();
	}
}